

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<std::complex<long_double>_>::Simetrize(TPZMatrix<std::complex<long_double>_> *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined8 *puVar5;
  undefined4 extraout_var_00;
  
  lVar9 = (this->super_TPZBaseMatrix).fRow;
  if (lVar9 != (this->super_TPZBaseMatrix).fCol) {
    Error("Simetrize only work for square matrices",(char *)0x0);
    lVar9 = (this->super_TPZBaseMatrix).fRow;
  }
  if (0 < lVar9) {
    lVar7 = 0;
    do {
      lVar8 = lVar7 + 1;
      for (lVar10 = lVar8; lVar10 < lVar9; lVar10 = lVar10 + 1) {
        iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                          (this,lVar7,lVar10);
        puVar5 = (undefined8 *)CONCAT44(extraout_var,iVar4);
        iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                          (this,lVar10,lVar7);
        puVar6 = (undefined8 *)CONCAT44(extraout_var_00,iVar4);
        uVar1 = puVar5[1];
        uVar2 = puVar5[2];
        uVar3 = puVar5[3];
        *puVar6 = *puVar5;
        puVar6[1] = uVar1;
        puVar6[2] = uVar2;
        puVar6[3] = uVar3;
      }
      lVar7 = lVar8;
    } while (lVar8 != lVar9);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Simetrize() {
  
  if ( Rows() != Cols() ) {
    Error( "Simetrize only work for square matrices" );
  }
  
  int64_t row,col;
  int64_t fDim1 = Rows();
  for(row=0; row<fDim1; row++) {
    for(col=row+1; col<fDim1; col++) {
      this->s(col,row) = this->s(row,col);
    }
  }
  
}